

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_srem(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  _Bool _Var2;
  BtorSimBitVector *b_00;
  BtorSimBitVector *pBVar3;
  BtorSimBitVector *bv;
  BtorSimBitVector *bv_00;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_01;
  BtorSimBitVector *bv_01;
  uint32_t uVar4;
  
  if (a->width == 1) {
    b_00 = btorsim_bv_not(b);
    pBVar3 = btorsim_bv_and(a,b_00);
  }
  else {
    uVar4 = a->width - 1;
    bv = btorsim_bv_slice(a,uVar4,uVar4);
    uVar4 = b->width - 1;
    bv_00 = btorsim_bv_slice(b,uVar4,uVar4);
    __ptr = btorsim_bv_neg(a);
    __ptr_00 = btorsim_bv_neg(b);
    _Var1 = btorsim_bv_is_true(bv);
    if (_Var1) {
      a = __ptr;
    }
    a_00 = btorsim_bv_copy(a);
    _Var2 = btorsim_bv_is_true(bv_00);
    if (_Var2) {
      b = __ptr_00;
    }
    b_01 = btorsim_bv_copy(b);
    bv_01 = btorsim_bv_urem(a_00,b_01);
    b_00 = btorsim_bv_neg(bv_01);
    pBVar3 = b_00;
    if (!_Var1) {
      pBVar3 = bv_01;
    }
    pBVar3 = btorsim_bv_copy(pBVar3);
    free(bv);
    free(bv_00);
    free(__ptr);
    free(__ptr_00);
    free(a_00);
    free(b_01);
    free(bv_01);
  }
  free(b_00);
  return pBVar3;
}

Assistant:

BtorSimBitVector *
btorsim_bv_srem (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_b, *sign_a, *sign_b, *neg_a, *neg_b;
  BtorSimBitVector *cond_a, *cond_b, *urem, *neg_urem;

  if (a->width == 1)
  {
    not_b = btorsim_bv_not (b);
    res   = btorsim_bv_and (a, not_b);
    btorsim_bv_free (not_b);
  }
  else
  {
    sign_a = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    neg_a  = btorsim_bv_neg (a);
    neg_b  = btorsim_bv_neg (b);
    /* normalize a and b if necessary */
    cond_a   = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_a)
                                           : btorsim_bv_copy (a);
    cond_b   = btorsim_bv_is_true (sign_b) ? btorsim_bv_copy (neg_b)
                                           : btorsim_bv_copy (b);
    urem     = btorsim_bv_urem (cond_a, cond_b);
    neg_urem = btorsim_bv_neg (urem);
    res      = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_urem)
                                           : btorsim_bv_copy (urem);
    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (urem);
    btorsim_bv_free (neg_urem);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}